

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revision_opt.cpp
# Opt level: O1

revision_opt * __thiscall
pstore::command_line::revision_opt::operator=(revision_opt *this,string *val)

{
  char in_AL;
  uint *puVar1;
  maybe<unsigned_int,_void> rp;
  maybe<unsigned_int,_void> local_18;
  
  if (val->_M_string_length != 0) {
    local_18.valid_ = (bool)in_AL;
    str_to_revision(&local_18,val);
    if (local_18.valid_ == false) {
      std::operator<<((ostream *)&std::cerr,
                      "Error: revision must be a revision number or \'HEAD\'\n");
      exit(1);
    }
    puVar1 = maybe<unsigned_int,_void>::operator->(&local_18);
    this->r_ = *puVar1;
  }
  return this;
}

Assistant:

revision_opt & revision_opt::operator= (std::string const & val) {
            if (!val.empty ()) {
                auto rp = pstore::str_to_revision (val);
                if (!rp) {
                    error_stream << PSTORE_NATIVE_TEXT (
                        "Error: revision must be a revision number or 'HEAD'\n");
                    std::exit (EXIT_FAILURE);
                }
                r_ = *rp;
            }
            return *this;
        }